

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::rememberInputs(FullyConnectedLayer *this,Array *inputs)

{
  element_type *this_00;
  Array *inputs_local;
  FullyConnectedLayer *this_local;
  
  this_00 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_ABackpropLayer).shared);
  std::valarray<float>::operator=(this_00,inputs);
  return;
}

Assistant:

void rememberInputs(const Array& inputs) {
        *(shared.inputBuffer) = inputs;  // remember for calcSensitivityFactors()
    }